

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O2

void __thiscall Js::PropertyGuard::InvalidateDuringSweep(PropertyGuard *this)

{
  JitPolyEquivalentTypeGuard *this_00;
  
  this->wasReincarnated = true;
  this->value = 2;
  if (this->isPoly == true) {
    this_00 = AsPolyTypeCheckGuard(this);
    JitPolyEquivalentTypeGuard::InvalidateDuringSweep(this_00);
    return;
  }
  return;
}

Assistant:

inline void PropertyGuard::InvalidateDuringSweep()
{
#if DBG
    wasReincarnated = true;
#endif
    this->value = GuardValue::Invalidated_DuringSweep;
#if ENABLE_NATIVE_CODEGEN
    if (this->IsPoly())
    {
        this->AsPolyTypeCheckGuard()->JitPolyEquivalentTypeGuard::InvalidateDuringSweep();
    }
#endif
}